

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  DTableDesc DVar1;
  undefined8 local_40;
  undefined1 uStack_33;
  DTableDesc dtd;
  HUF_DTable *DTable_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t maxDstSize_local;
  void *dst_local;
  
  DVar1 = HUF_getDTableDesc(DTable);
  uStack_33 = DVar1.tableType;
  if (uStack_33 == '\0') {
    local_40 = HUF_decompress4X1_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,0);
  }
  else {
    local_40 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,0);
  }
  return local_40;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize,
                                    const void* cSrc, size_t cSrcSize,
                                    const HUF_DTable* DTable)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#endif
}